

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

JavascriptAsyncFunction * __thiscall
Js::JavascriptLibrary::CreateAsyncFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,
          GeneratorVirtualScriptFunction *scriptFunction)

{
  code *pcVar1;
  char cVar2;
  bool bVar3;
  BOOL BVar4;
  DynamicType *type;
  Recycler *this_00;
  undefined4 *puVar5;
  JavascriptAsyncFunction *this_01;
  DynamicTypeHandler *typeHandler;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  cVar2 = (**(code **)((long)(scriptFunction->super_ScriptFunction).super_ScriptFunctionBase.
                             super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
                             super_FinalizableObject.super_IRecyclerVisitedObject + 0x3b8))
                    (scriptFunction);
  if (cVar2 == '\0') {
    typeHandler = (DynamicTypeHandler *)
                  &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncFunction,Js::InitializeFunctionDeferredTypeHandlerFilter<true,false,true>,false,(unsigned_short)0,(unsigned_short)0>
                   ::defaultInstance;
  }
  else {
    typeHandler = (DynamicTypeHandler *)
                  &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncFunction,Js::InitializeFunctionDeferredTypeHandlerFilter<false,false,true>,false,(unsigned_short)0,(unsigned_short)0>
                   ::defaultInstance;
  }
  type = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Function,
                          &((this->super_JavascriptLibraryBase).asyncFunctionPrototype.ptr)->
                           super_RecyclableObject,entryPoint,typeHandler,false,false);
  local_50 = (undefined1  [8])&JavascriptAsyncFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_765c5cc;
  data.filename._0_4_ = 0x19c1;
  this_00 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
  BVar4 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar3) goto LAB_00bf21fb;
    *puVar5 = 0;
  }
  this_01 = (JavascriptAsyncFunction *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                      (this_00,0x38);
  if (this_01 == (JavascriptAsyncFunction *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                ,0xa70,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) {
LAB_00bf21fb:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  JavascriptAsyncFunction::JavascriptAsyncFunction(this_01,type,scriptFunction);
  return this_01;
}

Assistant:

JavascriptAsyncFunction* JavascriptLibrary::CreateAsyncFunction(JavascriptMethod entryPoint, GeneratorVirtualScriptFunction* scriptFunction)
    {
        DynamicType* type = CreateDeferredPrototypeAsyncFunctionType(entryPoint, scriptFunction->IsAnonymousFunction());

        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptAsyncFunction, type, scriptFunction);
    }